

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

int Curl_blockread_all(connectdata *conn,curl_socket_t sockfd,char *buf,ssize_t buffersize,
                      ssize_t *n)

{
  int iVar1;
  CURLcode CVar2;
  long timeout_ms;
  long timeleft;
  long lStack_40;
  int result;
  ssize_t allread;
  ssize_t nread;
  ssize_t *n_local;
  ssize_t buffersize_local;
  char *buf_local;
  connectdata *pcStack_10;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  lStack_40 = 0;
  *n = 0;
  nread = (ssize_t)n;
  n_local = (ssize_t *)buffersize;
  buffersize_local = (ssize_t)buf;
  buf_local._4_4_ = sockfd;
  pcStack_10 = conn;
  while( true ) {
    do {
      timeout_ms = Curl_timeleft(pcStack_10->data,(timeval *)0x0,true);
      if (timeout_ms < 0) {
        return 0x1c;
      }
      iVar1 = Curl_socket_check(buf_local._4_4_,-1,-1,timeout_ms);
      if (iVar1 < 1) {
        return -1;
      }
      CVar2 = Curl_read_plain(buf_local._4_4_,(char *)buffersize_local,(size_t)n_local,&allread);
    } while (CVar2 == CURLE_AGAIN);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (n_local == (ssize_t *)allread) break;
    if (allread == 0) {
      return -1;
    }
    n_local = (ssize_t *)((long)n_local - allread);
    buffersize_local = allread + buffersize_local;
    lStack_40 = allread + lStack_40;
  }
  *(ssize_t *)nread = allread + lStack_40;
  return 0;
}

Assistant:

int Curl_blockread_all(struct connectdata *conn, /* connection data */
                       curl_socket_t sockfd,     /* read from this socket */
                       char *buf,                /* store read data here */
                       ssize_t buffersize,       /* max amount to read */
                       ssize_t *n)               /* amount bytes read */
{
  ssize_t nread;
  ssize_t allread = 0;
  int result;
  long timeleft;
  *n = 0;
  for(;;) {
    timeleft = Curl_timeleft(conn->data, NULL, TRUE);
    if(timeleft < 0) {
      /* we already got the timeout */
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(Curl_socket_ready(sockfd, CURL_SOCKET_BAD, timeleft) <= 0) {
      result = ~CURLE_OK;
      break;
    }
    result = Curl_read_plain(sockfd, buf, buffersize, &nread);
    if(CURLE_AGAIN == result)
      continue;
    else if(result)
      break;

    if(buffersize == nread) {
      allread += nread;
      *n = allread;
      result = CURLE_OK;
      break;
    }
    if(!nread) {
      result = ~CURLE_OK;
      break;
    }

    buffersize -= nread;
    buf += nread;
    allread += nread;
  }
  return result;
}